

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

float __thiscall
duckdb::Interpolator<true>::Operation<float,float,duckdb::QuantileDirect<float>>
          (Interpolator<true> *this,float *v_t,Vector *result,QuantileDirect<float> *accessor)

{
  bool bVar1;
  InvalidInputException *this_00;
  duckdb *this_01;
  RESULT_TYPE_conflict3 input;
  float result_1;
  float local_3c;
  string local_38;
  
  input = InterpolateInternal<float,duckdb::QuantileDirect<float>>(this,v_t,accessor);
  this_01 = (duckdb *)0x0;
  bVar1 = TryCast::Operation<float,float>(input,&local_3c,false);
  if (bVar1) {
    return local_3c;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  CastExceptionText<float,float>(&local_38,this_01,input);
  InvalidInputException::InvalidInputException(this_00,(string *)&local_38);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(InterpolateInternal(v_t, accessor), result);
	}